

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterInfo.cpp
# Opt level: O1

void __thiscall
helics::FilterInfo::addDestinationEndpoint
          (FilterInfo *this,GlobalHandle dest,string_view destName,string_view destType)

{
  pointer pEVar1;
  pointer pGVar2;
  pointer pEVar3;
  EptInformation *ti;
  pointer pEVar4;
  bool bVar5;
  GlobalHandle local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_38._M_str = destType._M_str;
  local_38._M_len = destType._M_len;
  local_28._M_str = destName._M_str;
  local_28._M_len = destName._M_len;
  pEVar4 = (this->destEndpoints).
           super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->destEndpoints).
           super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar5 = pEVar4 == pEVar1;
  if (!bVar5) {
    if (((pEVar4->id).fed_id.gid != dest.fed_id.gid.gid) ||
       ((pEVar4->id).handle.hid != dest.handle.hid.hid)) {
      pEVar4 = pEVar4 + 1;
      do {
        pEVar3 = pEVar4;
        bVar5 = pEVar3 == pEVar1;
        if (bVar5) goto LAB_0034112c;
        pEVar4 = pEVar3 + 1;
      } while (((pEVar3->id).fed_id.gid != dest.fed_id.gid.gid) ||
              ((pEVar3->id).handle.hid != dest.handle.hid.hid));
    }
    if (!bVar5) {
      return;
    }
  }
LAB_0034112c:
  local_40 = dest;
  std::vector<helics::EptInformation,std::allocator<helics::EptInformation>>::
  emplace_back<helics::GlobalHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((vector<helics::EptInformation,std::allocator<helics::EptInformation>> *)
             &this->destEndpoints,&local_40,&local_28,&local_38);
  std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::reserve
            (&this->destTargets,
             ((long)(this->destEndpoints).
                    super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->destEndpoints).
                    super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
  pGVar2 = (this->destTargets).
           super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->destTargets).
      super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar2) {
    (this->destTargets).
    super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar2;
  }
  (this->destEpts)._M_string_length = 0;
  *(this->destEpts)._M_dataplus._M_p = '\0';
  pEVar1 = (this->destEndpoints).
           super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pEVar4 = (this->destEndpoints).
                super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
                _M_impl.super__Vector_impl_data._M_start; pEVar4 != pEVar1; pEVar4 = pEVar4 + 1) {
    std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>::
    emplace_back<helics::GlobalHandle_const&>
              ((vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>> *)
               &this->destTargets,&pEVar4->id);
  }
  return;
}

Assistant:

void FilterInfo::addDestinationEndpoint(GlobalHandle dest,
                                        std::string_view destName,
                                        std::string_view destType)
{
    for (const auto& ti : destEndpoints) {
        if (ti.id == dest) {
            return;
        }
    }
    destEndpoints.emplace_back(dest, destName, destType);
    /** now update the target information*/
    destTargets.reserve(destEndpoints.size());
    destTargets.clear();
    destEpts.clear();
    for (const auto& ti : destEndpoints) {
        destTargets.emplace_back(ti.id);
    }
}